

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

uECC_word_t
EccPoint_compute_public_key(uECC_word_t *result,uECC_word_t *private_key,uECC_Curve curve)

{
  int iVar1;
  uECC_word_t uVar2;
  uECC_word_t carry;
  uECC_word_t *initial_Z;
  uECC_word_t *p2 [2];
  uECC_word_t tmp2 [4];
  uECC_word_t tmp1 [4];
  uECC_Curve curve_local;
  uECC_word_t *private_key_local;
  uECC_word_t *result_local;
  
  p2[0] = (uECC_word_t *)(p2 + 1);
  carry = 0;
  uVar2 = regularize_k(private_key,tmp2 + 3,(uECC_word_t *)(p2 + 1),curve);
  if (g_rng_function != (uECC_RNG_Function)0x0) {
    iVar1 = uECC_generate_random_int(p2[uVar2 - 1],curve->p,curve->num_words);
    if (iVar1 == 0) {
      return 0;
    }
    carry = (uECC_word_t)p2[uVar2 - 1];
  }
  EccPoint_mult(result,curve->G,p2[(long)(int)(uint)((uVar2 != 0 ^ 0xffU) & 1) + -1],
                (uECC_word_t *)carry,curve->num_n_bits + 1,curve);
  uVar2 = uECC_vli_isZero(result,curve->num_words << 1);
  result_local = (uECC_word_t *)(ulong)(uVar2 == 0);
  return (uECC_word_t)result_local;
}

Assistant:

static uECC_word_t EccPoint_compute_public_key(uECC_word_t *result,
                                               uECC_word_t *private_key,
                                               uECC_Curve curve) {
    uECC_word_t tmp1[uECC_MAX_WORDS];
    uECC_word_t tmp2[uECC_MAX_WORDS];
    uECC_word_t *p2[2] = {tmp1, tmp2};
    uECC_word_t *initial_Z = 0;
    uECC_word_t carry;

    /* Regularize the bitcount for the private key so that attackers cannot use a side channel
       attack to learn the number of leading zeros. */
    carry = regularize_k(private_key, tmp1, tmp2, curve);

    /* If an RNG function was specified, try to get a random initial Z value to improve
       protection against side-channel attacks. */
    if (g_rng_function) {
        if (!uECC_generate_random_int(p2[carry], curve->p, curve->num_words)) {
            return 0;
        }
        initial_Z = p2[carry];
    }
    EccPoint_mult(result, curve->G, p2[!carry], initial_Z, curve->num_n_bits + 1, curve);

    if (EccPoint_isZero(result, curve)) {
        return 0;
    }
    return 1;
}